

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sceneRender.cpp
# Opt level: O1

void __thiscall
SceneRender::commandsInit(SceneRender *this,CommandList *_commands,Uniforms *_uniforms)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  string local_2a0;
  string local_280;
  string local_260;
  Command local_240;
  _Any_data local_1b8;
  code *local_1a8;
  code *pcStack_1a0;
  _Any_data local_198;
  code *local_188;
  code *pcStack_180;
  _Any_data local_178;
  code *local_168;
  code *pcStack_160;
  _Any_data local_158;
  code *local_148;
  code *pcStack_140;
  _Any_data local_138;
  code *local_128;
  code *pcStack_120;
  _Any_data local_118;
  code *local_108;
  code *pcStack_100;
  _Any_data local_f8;
  code *local_e8;
  code *pcStack_e0;
  _Any_data local_d8;
  code *local_c8;
  code *pcStack_c0;
  _Any_data local_b8;
  code *local_a8;
  code *pcStack_a0;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  if (this->m_commands_loaded == false) {
    paVar1 = &local_260.field_2;
    local_260._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"model","");
    local_58._8_8_ = 0;
    pcStack_40 = std::
                 _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sceneRender.cpp:61:46)>
                 ::_M_invoke;
    local_48 = std::
               _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sceneRender.cpp:61:46)>
               ::_M_manager;
    paVar2 = &local_280.field_2;
    local_280._M_dataplus._M_p = (pointer)paVar2;
    local_58._M_unused._M_object = _uniforms;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"models","");
    paVar3 = &local_2a0.field_2;
    local_2a0._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2a0,"print all the names of the models","");
    Command::Command(&local_240,&local_260,
                     (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)&local_58,&local_280,&local_2a0,true);
    std::vector<Command,_std::allocator<Command>_>::emplace_back<Command>(_commands,&local_240);
    if (local_240.exec.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_240.exec.super__Function_base._M_manager)
                ((_Any_data *)&local_240.exec,(_Any_data *)&local_240.exec,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.description._M_dataplus._M_p != &local_240.description.field_2) {
      operator_delete(local_240.description._M_dataplus._M_p,
                      local_240.description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.formula._M_dataplus._M_p != &local_240.formula.field_2) {
      operator_delete(local_240.formula._M_dataplus._M_p,
                      local_240.formula.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.trigger._M_dataplus._M_p != &local_240.trigger.field_2) {
      operator_delete(local_240.trigger._M_dataplus._M_p,
                      local_240.trigger.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != paVar3) {
      operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != paVar2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != paVar1) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    local_260._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"origin","");
    local_78._8_8_ = 0;
    pcStack_60 = std::
                 _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sceneRender.cpp:93:47)>
                 ::_M_invoke;
    local_68 = std::
               _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sceneRender.cpp:93:47)>
               ::_M_manager;
    local_280._M_dataplus._M_p = (pointer)paVar2;
    local_78._M_unused._M_object = this;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"origin[,<x>,<y>,<z>]","");
    local_2a0._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2a0,"get or set the origin position.","");
    Command::Command(&local_240,&local_260,
                     (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)&local_78,&local_280,&local_2a0,true);
    std::vector<Command,_std::allocator<Command>_>::emplace_back<Command>(_commands,&local_240);
    if (local_240.exec.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_240.exec.super__Function_base._M_manager)
                ((_Any_data *)&local_240.exec,(_Any_data *)&local_240.exec,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.description._M_dataplus._M_p != &local_240.description.field_2) {
      operator_delete(local_240.description._M_dataplus._M_p,
                      local_240.description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.formula._M_dataplus._M_p != &local_240.formula.field_2) {
      operator_delete(local_240.formula._M_dataplus._M_p,
                      local_240.formula.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.trigger._M_dataplus._M_p != &local_240.trigger.field_2) {
      operator_delete(local_240.trigger._M_dataplus._M_p,
                      local_240.trigger.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != paVar3) {
      operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != paVar2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
    if (local_68 != (code *)0x0) {
      (*local_68)(&local_78,&local_78,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != paVar1) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    local_260._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"material","");
    local_98._8_8_ = 0;
    pcStack_80 = std::
                 _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sceneRender.cpp:108:49)>
                 ::_M_invoke;
    local_88 = std::
               _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sceneRender.cpp:108:49)>
               ::_M_manager;
    local_280._M_dataplus._M_p = (pointer)paVar2;
    local_98._M_unused._M_object = _uniforms;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"materials","");
    local_2a0._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2a0,"print all the materials names","");
    Command::Command(&local_240,&local_260,
                     (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)&local_98,&local_280,&local_2a0,true);
    std::vector<Command,_std::allocator<Command>_>::emplace_back<Command>(_commands,&local_240);
    if (local_240.exec.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_240.exec.super__Function_base._M_manager)
                ((_Any_data *)&local_240.exec,(_Any_data *)&local_240.exec,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.description._M_dataplus._M_p != &local_240.description.field_2) {
      operator_delete(local_240.description._M_dataplus._M_p,
                      local_240.description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.formula._M_dataplus._M_p != &local_240.formula.field_2) {
      operator_delete(local_240.formula._M_dataplus._M_p,
                      local_240.formula.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.trigger._M_dataplus._M_p != &local_240.trigger.field_2) {
      operator_delete(local_240.trigger._M_dataplus._M_p,
                      local_240.trigger.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != paVar3) {
      operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != paVar2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
    if (local_88 != (code *)0x0) {
      (*local_88)(&local_98,&local_98,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != paVar1) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    local_260._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"blend","");
    local_b8._8_8_ = 0;
    pcStack_a0 = std::
                 _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sceneRender.cpp:130:46)>
                 ::_M_invoke;
    local_a8 = std::
               _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sceneRender.cpp:130:46)>
               ::_M_manager;
    local_280._M_dataplus._M_p = (pointer)paVar2;
    local_b8._M_unused._M_object = this;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_280,"blend[,alpha|add|multiply|screen|substract]","");
    local_2a0._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2a0,"get or set the blending modes","");
    Command::Command(&local_240,&local_260,
                     (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)&local_b8,&local_280,&local_2a0,true);
    std::vector<Command,_std::allocator<Command>_>::emplace_back<Command>(_commands,&local_240);
    if (local_240.exec.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_240.exec.super__Function_base._M_manager)
                ((_Any_data *)&local_240.exec,(_Any_data *)&local_240.exec,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.description._M_dataplus._M_p != &local_240.description.field_2) {
      operator_delete(local_240.description._M_dataplus._M_p,
                      local_240.description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.formula._M_dataplus._M_p != &local_240.formula.field_2) {
      operator_delete(local_240.formula._M_dataplus._M_p,
                      local_240.formula.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.trigger._M_dataplus._M_p != &local_240.trigger.field_2) {
      operator_delete(local_240.trigger._M_dataplus._M_p,
                      local_240.trigger.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != paVar3) {
      operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != paVar2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
    if (local_a8 != (code *)0x0) {
      (*local_a8)(&local_b8,&local_b8,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != paVar1) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    local_260._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"depth_test","");
    local_d8._8_8_ = 0;
    pcStack_c0 = std::
                 _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sceneRender.cpp:157:51)>
                 ::_M_invoke;
    local_c8 = std::
               _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sceneRender.cpp:157:51)>
               ::_M_manager;
    local_280._M_dataplus._M_p = (pointer)paVar2;
    local_d8._M_unused._M_object = this;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"depth_test[,on|off]","");
    local_2a0._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2a0,"turn on/off depth test","");
    Command::Command(&local_240,&local_260,
                     (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)&local_d8,&local_280,&local_2a0,true);
    std::vector<Command,_std::allocator<Command>_>::emplace_back<Command>(_commands,&local_240);
    if (local_240.exec.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_240.exec.super__Function_base._M_manager)
                ((_Any_data *)&local_240.exec,(_Any_data *)&local_240.exec,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.description._M_dataplus._M_p != &local_240.description.field_2) {
      operator_delete(local_240.description._M_dataplus._M_p,
                      local_240.description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.formula._M_dataplus._M_p != &local_240.formula.field_2) {
      operator_delete(local_240.formula._M_dataplus._M_p,
                      local_240.formula.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.trigger._M_dataplus._M_p != &local_240.trigger.field_2) {
      operator_delete(local_240.trigger._M_dataplus._M_p,
                      local_240.trigger.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != paVar3) {
      operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != paVar2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
    if (local_c8 != (code *)0x0) {
      (*local_c8)(&local_d8,&local_d8,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != paVar1) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    local_260._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"culling","");
    local_f8._8_8_ = 0;
    pcStack_e0 = std::
                 _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sceneRender.cpp:174:48)>
                 ::_M_invoke;
    local_e8 = std::
               _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sceneRender.cpp:174:48)>
               ::_M_manager;
    local_280._M_dataplus._M_p = (pointer)paVar2;
    local_f8._M_unused._M_object = this;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_280,"culling[,none|front|back|both]","");
    local_2a0._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2a0,"get or set the culling modes","");
    Command::Command(&local_240,&local_260,
                     (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)&local_f8,&local_280,&local_2a0,true);
    std::vector<Command,_std::allocator<Command>_>::emplace_back<Command>(_commands,&local_240);
    if (local_240.exec.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_240.exec.super__Function_base._M_manager)
                ((_Any_data *)&local_240.exec,(_Any_data *)&local_240.exec,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.description._M_dataplus._M_p != &local_240.description.field_2) {
      operator_delete(local_240.description._M_dataplus._M_p,
                      local_240.description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.formula._M_dataplus._M_p != &local_240.formula.field_2) {
      operator_delete(local_240.formula._M_dataplus._M_p,
                      local_240.formula.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.trigger._M_dataplus._M_p != &local_240.trigger.field_2) {
      operator_delete(local_240.trigger._M_dataplus._M_p,
                      local_240.trigger.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != paVar3) {
      operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != paVar2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
    if (local_e8 != (code *)0x0) {
      (*local_e8)(&local_f8,&local_f8,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != paVar1) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    local_260._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"dynamic_shadows","");
    local_118._8_8_ = 0;
    pcStack_100 = std::
                  _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sceneRender.cpp:197:56)>
                  ::_M_invoke;
    local_108 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sceneRender.cpp:197:56)>
                ::_M_manager;
    local_280._M_dataplus._M_p = (pointer)paVar2;
    local_118._M_unused._M_object = this;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_280,"dynamic_shadows[,on|off]","");
    local_2a0._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2a0,"get or set dynamic shadows","");
    Command::Command(&local_240,&local_260,
                     (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)&local_118,&local_280,&local_2a0,true);
    std::vector<Command,_std::allocator<Command>_>::emplace_back<Command>(_commands,&local_240);
    if (local_240.exec.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_240.exec.super__Function_base._M_manager)
                ((_Any_data *)&local_240.exec,(_Any_data *)&local_240.exec,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.description._M_dataplus._M_p != &local_240.description.field_2) {
      operator_delete(local_240.description._M_dataplus._M_p,
                      local_240.description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.formula._M_dataplus._M_p != &local_240.formula.field_2) {
      operator_delete(local_240.formula._M_dataplus._M_p,
                      local_240.formula.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.trigger._M_dataplus._M_p != &local_240.trigger.field_2) {
      operator_delete(local_240.trigger._M_dataplus._M_p,
                      local_240.trigger.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != paVar3) {
      operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != paVar2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
    if (local_108 != (code *)0x0) {
      (*local_108)(&local_118,&local_118,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != paVar1) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    local_260._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"floor_color","");
    pcStack_1a0 = std::
                  _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sceneRender.cpp:214:52)>
                  ::_M_invoke;
    local_1a8 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sceneRender.cpp:214:52)>
                ::_M_manager;
    local_280._M_dataplus._M_p = (pointer)paVar2;
    local_1b8._M_unused._M_object = this;
    local_1b8._8_8_ = _uniforms;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_280,"floor_color[,<r>,<g>,<b>]","");
    local_2a0._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2a0,"get or set the ground color of the skybox.","");
    Command::Command(&local_240,&local_260,
                     (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)&local_1b8,&local_280,&local_2a0,true);
    std::vector<Command,_std::allocator<Command>_>::emplace_back<Command>(_commands,&local_240);
    if (local_240.exec.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_240.exec.super__Function_base._M_manager)
                ((_Any_data *)&local_240.exec,(_Any_data *)&local_240.exec,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.description._M_dataplus._M_p != &local_240.description.field_2) {
      operator_delete(local_240.description._M_dataplus._M_p,
                      local_240.description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.formula._M_dataplus._M_p != &local_240.formula.field_2) {
      operator_delete(local_240.formula._M_dataplus._M_p,
                      local_240.formula.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.trigger._M_dataplus._M_p != &local_240.trigger.field_2) {
      operator_delete(local_240.trigger._M_dataplus._M_p,
                      local_240.trigger.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != paVar3) {
      operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != paVar2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
    if (local_1a8 != (code *)0x0) {
      (*local_1a8)(&local_1b8,&local_1b8,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != paVar1) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    local_260._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"floor","");
    local_138._8_8_ = 0;
    pcStack_120 = std::
                  _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sceneRender.cpp:233:46)>
                  ::_M_invoke;
    local_128 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sceneRender.cpp:233:46)>
                ::_M_manager;
    local_280._M_dataplus._M_p = (pointer)paVar2;
    local_138._M_unused._M_object = this;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_280,"floor[,on|off|<subD_level>]","");
    local_2a0._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2a0,"show/hide floor or presice the subdivision level","");
    Command::Command(&local_240,&local_260,
                     (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)&local_138,&local_280,&local_2a0,true);
    std::vector<Command,_std::allocator<Command>_>::emplace_back<Command>(_commands,&local_240);
    if (local_240.exec.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_240.exec.super__Function_base._M_manager)
                ((_Any_data *)&local_240.exec,(_Any_data *)&local_240.exec,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.description._M_dataplus._M_p != &local_240.description.field_2) {
      operator_delete(local_240.description._M_dataplus._M_p,
                      local_240.description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.formula._M_dataplus._M_p != &local_240.formula.field_2) {
      operator_delete(local_240.formula._M_dataplus._M_p,
                      local_240.formula.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.trigger._M_dataplus._M_p != &local_240.trigger.field_2) {
      operator_delete(local_240.trigger._M_dataplus._M_p,
                      local_240.trigger.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != paVar3) {
      operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != paVar2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
    if (local_128 != (code *)0x0) {
      (*local_128)(&local_138,&local_138,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != paVar1) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    local_260._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"grid","");
    local_158._8_8_ = 0;
    pcStack_140 = std::
                  _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sceneRender.cpp:261:45)>
                  ::_M_invoke;
    local_148 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sceneRender.cpp:261:45)>
                ::_M_manager;
    local_280._M_dataplus._M_p = (pointer)paVar2;
    local_158._M_unused._M_object = this;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"grid[,on|off]","");
    local_2a0._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"show/hide grid","");
    Command::Command(&local_240,&local_260,
                     (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)&local_158,&local_280,&local_2a0,true);
    std::vector<Command,_std::allocator<Command>_>::emplace_back<Command>(_commands,&local_240);
    if (local_240.exec.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_240.exec.super__Function_base._M_manager)
                ((_Any_data *)&local_240.exec,(_Any_data *)&local_240.exec,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.description._M_dataplus._M_p != &local_240.description.field_2) {
      operator_delete(local_240.description._M_dataplus._M_p,
                      local_240.description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.formula._M_dataplus._M_p != &local_240.formula.field_2) {
      operator_delete(local_240.formula._M_dataplus._M_p,
                      local_240.formula.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.trigger._M_dataplus._M_p != &local_240.trigger.field_2) {
      operator_delete(local_240.trigger._M_dataplus._M_p,
                      local_240.trigger.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != paVar3) {
      operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != paVar2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
    if (local_148 != (code *)0x0) {
      (*local_148)(&local_158,&local_158,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != paVar1) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    local_260._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"axis","");
    local_178._8_8_ = 0;
    pcStack_160 = std::
                  _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sceneRender.cpp:281:45)>
                  ::_M_invoke;
    local_168 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sceneRender.cpp:281:45)>
                ::_M_manager;
    local_280._M_dataplus._M_p = (pointer)paVar2;
    local_178._M_unused._M_object = this;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"axis[,on|off]","");
    local_2a0._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"show/hide axis","");
    Command::Command(&local_240,&local_260,
                     (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)&local_178,&local_280,&local_2a0,true);
    std::vector<Command,_std::allocator<Command>_>::emplace_back<Command>(_commands,&local_240);
    if (local_240.exec.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_240.exec.super__Function_base._M_manager)
                ((_Any_data *)&local_240.exec,(_Any_data *)&local_240.exec,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.description._M_dataplus._M_p != &local_240.description.field_2) {
      operator_delete(local_240.description._M_dataplus._M_p,
                      local_240.description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.formula._M_dataplus._M_p != &local_240.formula.field_2) {
      operator_delete(local_240.formula._M_dataplus._M_p,
                      local_240.formula.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.trigger._M_dataplus._M_p != &local_240.trigger.field_2) {
      operator_delete(local_240.trigger._M_dataplus._M_p,
                      local_240.trigger.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != paVar3) {
      operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != paVar2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
    if (local_168 != (code *)0x0) {
      (*local_168)(&local_178,&local_178,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != paVar1) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    local_260._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"bboxes","");
    local_198._8_8_ = 0;
    pcStack_180 = std::
                  _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sceneRender.cpp:301:47)>
                  ::_M_invoke;
    local_188 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sceneRender.cpp:301:47)>
                ::_M_manager;
    local_280._M_dataplus._M_p = (pointer)paVar2;
    local_198._M_unused._M_object = this;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"bboxes[,on|off]","");
    local_2a0._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2a0,"show/hide models bounding boxes","");
    Command::Command(&local_240,&local_260,
                     (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)&local_198,&local_280,&local_2a0,true);
    std::vector<Command,_std::allocator<Command>_>::emplace_back<Command>(_commands,&local_240);
    if (local_240.exec.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_240.exec.super__Function_base._M_manager)
                ((_Any_data *)&local_240.exec,(_Any_data *)&local_240.exec,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.description._M_dataplus._M_p != &local_240.description.field_2) {
      operator_delete(local_240.description._M_dataplus._M_p,
                      local_240.description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.formula._M_dataplus._M_p != &local_240.formula.field_2) {
      operator_delete(local_240.formula._M_dataplus._M_p,
                      local_240.formula.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.trigger._M_dataplus._M_p != &local_240.trigger.field_2) {
      operator_delete(local_240.trigger._M_dataplus._M_p,
                      local_240.trigger.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != paVar3) {
      operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != paVar2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
    if (local_188 != (code *)0x0) {
      (*local_188)(&local_198,&local_198,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != paVar1) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    this->m_commands_loaded = true;
  }
  return;
}

Assistant:

void SceneRender::commandsInit(CommandList& _commands, Uniforms& _uniforms) {
    if (!m_commands_loaded) {

        // ADD COMMANDS
        // ----------------------------------------- 
        _commands.push_back(Command("model", [&](const std::string& _line){ 
            if (_line == "models") {
                for (vera::ModelsMap::iterator it = _uniforms.models.begin(); it != _uniforms.models.end(); ++it)
                    std::cout << it->second->getName() << std::endl;
                return true;
            }
            else {
                std::vector<std::string> values = vera::split(_line,',');
                if (values.size() == 2) {
                    for (vera::ModelsMap::iterator it = _uniforms.models.begin(); it != _uniforms.models.end(); ++it)
                        if (it->second->getName() == values[1]) {
                            it->second->printVboInfo();
                            std::cout << "Defines:" << std::endl;
                            it->second->printDefines();
                            std::cout << "Position:" << std::endl;
                            glm::vec3 pos = it->second->getPosition();
                            std::cout << pos.x << ',' << pos.y << ',' << pos.z << std::endl;
                            return true;
                        }
                }
                else if (values.size() == 5) {
                    for (vera::ModelsMap::iterator it = _uniforms.models.begin(); it != _uniforms.models.end(); ++it)
                        if (it->second->getName() == values[1]) {
                            it->second->setPosition( glm::vec3(vera::toFloat(values[2]), vera::toFloat(values[3]), vera::toFloat(values[4])) );
                            return true;
                        }
                }
            }
            return false;
        },
        "models", "print all the names of the models"));

        _commands.push_back(Command("origin", [&](const std::string& _line){ 
            std::vector<std::string> values = vera::split(_line,',');
            if (values.size() == 4) {
                m_origin.setPosition( glm::vec3(vera::toFloat(values[1]), vera::toFloat(values[2]), vera::toFloat(values[3])) );
                return true;
            }
            else {
                glm::vec3 pos = m_origin.getPosition();
                std::cout << pos.x << ',' << pos.y << ',' << pos.z << std::endl;
                return true;
            }
            return false;
        },
        "origin[,<x>,<y>,<z>]", "get or set the origin position."));

        _commands.push_back(Command("material", [&](const std::string& _line){ 
            if (_line == "materials") {
                for (vera::MaterialsMap::iterator it = _uniforms.materials.begin(); it != _uniforms.materials.end(); it++)
                    std::cout << it->second->name << std::endl;
                return true;
            }
            else {
                std::vector<std::string> values = vera::split(_line,',');
                if (values.size() == 2 && values[0] == "material") {
                    for (vera::MaterialsMap::iterator it = _uniforms.materials.begin(); it != _uniforms.materials.end(); it++) {
                        if (it->second->name == values[1]) {
                            it->second->printDefines();
                            return true;
                        }
                    }
                }
            }

            return false;
        },
        "materials", "print all the materials names"));

        _commands.push_back(Command("blend", [&](const std::string& _line){ 
            std::vector<std::string> values = vera::split(_line,',');
            if (values.size() == 1) {
                if (getBlend() == vera::BLEND_NONE) std::cout << "none" << std::endl;
                else if (getBlend() == vera::BLEND_ALPHA) std::cout << "alpha" << std::endl;
                else if (getBlend() == vera::BLEND_ADD) std::cout << "add" << std::endl;
                else if (getBlend() == vera::BLEND_MULTIPLY) std::cout << "multiply" << std::endl;
                else if (getBlend() == vera::BLEND_SCREEN) std::cout << "screen" << std::endl;
                else if (getBlend() == vera::BLEND_SUBSTRACT) std::cout << "substract" << std::endl;
                
                return true;
            }
            else if (values.size() == 2) {
                if (values[1] == "none" || values[1] == "off") setBlend(vera::BLEND_NONE);
                else if (values[1] == "alpha") setBlend(vera::BLEND_ALPHA);
                else if (values[1] == "add") setBlend(vera::BLEND_ADD);
                else if (values[1] == "multiply") setBlend(vera::BLEND_MULTIPLY);
                else if (values[1] == "screen") setBlend(vera::BLEND_SCREEN);
                else if (values[1] == "substract") setBlend(vera::BLEND_SUBSTRACT);

                return true;
            }

            return false;
        },
        "blend[,alpha|add|multiply|screen|substract]", "get or set the blending modes"));

        _commands.push_back(Command("depth_test", [&](const std::string& _line){ 
            if (_line == "depth_test") {
                std::string rta = m_depth_test ? "on" : "off";
                std::cout <<  rta << std::endl; 
                return true;
            }
            else {
                std::vector<std::string> values = vera::split(_line,',');
                if (values.size() == 2) {
                    m_depth_test = (values[1] == "on");
                    return true;
                }
            }
            return false;
        },
        "depth_test[,on|off]", "turn on/off depth test"));

        _commands.push_back(Command("culling", [&](const std::string& _line){ 
            std::vector<std::string> values = vera::split(_line,',');
            if (values.size() == 1) {
                if (getCulling() == vera::CULL_NONE) std::cout << "none" << std::endl;
                else if (getCulling() == vera::CULL_FRONT) std::cout << "front" << std::endl;
                else if (getCulling() == vera::CULL_BACK) std::cout << "back" << std::endl;
                else if (getCulling() == vera::CULL_BOTH) std::cout << "both" << std::endl;

                return true;
            }
            else if (values.size() == 2) {
                if (values[1] == "none") setCulling(vera::CULL_NONE);
                else if (values[1] == "front") setCulling(vera::CULL_FRONT);
                else if (values[1] == "back") setCulling(vera::CULL_BACK);
                else if (values[1] == "both") setCulling(vera::CULL_BOTH);

                return true;
            }

            return false;
        },
        "culling[,none|front|back|both]", "get or set the culling modes"));
        
        _commands.push_back(Command("dynamic_shadows", [&](const std::string& _line){ 
            if (_line == "dynamic_shadows") {
                std::string rta = dynamicShadows ? "on" : "off";
                std::cout <<  rta << std::endl; 
                return true;
            }
            else {
                std::vector<std::string> values = vera::split(_line,',');
                if (values.size() == 2) {
                    dynamicShadows = (values[1] == "on");
                    return true;
                }
            }
            return false;
        },
        "dynamic_shadows[,on|off]", "get or set dynamic shadows"));

        _commands.push_back(Command("floor_color", [&](const std::string& _line){ 
            std::vector<std::string> values = vera::split(_line,',');
            if (values.size() == 4) {
                std::string str_color = "vec4("+values[1]+","+values[2]+","+values[3]+",1.0)"; 
                addDefine("FLOOR_COLOR",str_color);
                
                _uniforms.setGroundAlbedo( glm::vec3(vera::toFloat(values[1]), vera::toFloat(values[2]), vera::toFloat(values[3])) );
                _uniforms.activeCubemap = _uniforms.cubemaps["default"];
                return true;
            }
            else {
                glm::vec3 ground = _uniforms.getGroundAlbedo();
                std::cout << ground.x << ',' << ground.y << ',' << ground.z << std::endl;
                return true;
            }
            return false;
        },
        "floor_color[,<r>,<g>,<b>]", "get or set the ground color of the skybox."));
        
        _commands.push_back(Command("floor", [&](const std::string& _line) {
            std::vector<std::string> values = vera::split(_line,',');

            if (_line == "floor") {
                std::string rta = m_floor_subd > 0 ? vera::toString(m_floor_subd) : "off";
                std::cout << rta << std::endl; 
                return true;
            }
            else {
                if (values.size() == 2) {
                    if (values[1] == "toggle")
                        values[1] = m_floor_subd_target >= 0 ? "off" : "on";

                    if (values[1] == "off")
                        m_floor_subd_target = -1;
                    else if (values[1] == "on") {
                        if (m_floor_subd_target == -1)
                            m_floor_subd_target = 0;
                    }
                    else
                        m_floor_subd_target = vera::toInt(values[1]);
                    return true;
                }
            }
            return false;
        },
        "floor[,on|off|<subD_level>]", "show/hide floor or presice the subdivision level"));

        _commands.push_back(Command("grid", [&](const std::string& _line){
            if (_line == "grid") {
                std::string rta = showGrid ? "on" : "off";
                std::cout << rta << std::endl; 
                return true;
            }
            else {
                std::vector<std::string> values = vera::split(_line,',');
                if (values.size() == 2) {
                    if (values[1] == "toggle")
                        values[1] = showGrid ? "off" : "on";

                    showGrid = values[1] == "on";
                    return true;
                }
            }
            return false;
        },
        "grid[,on|off]", "show/hide grid"));

        _commands.push_back(Command("axis", [&](const std::string& _line){
            if (_line == "grid") {
                std::string rta = showAxis ? "on" : "off";
                std::cout << rta << std::endl; 
                return true;
            }
            else {
                std::vector<std::string> values = vera::split(_line,',');
                if (values.size() == 2) {
                    if (values[1] == "toggle")
                        values[1] = showAxis ? "off" : "on";

                    showAxis = values[1] == "on";
                    return true;
                }
            }
            return false;
        },
        "axis[,on|off]", "show/hide axis"));

        _commands.push_back(Command("bboxes", [&](const std::string& _line){
            if (_line == "bboxes") {
                std::string rta = showBBoxes ? "on" : "off";
                std::cout << rta << std::endl; 
                return true;
            }
            else {
                std::vector<std::string> values = vera::split(_line,',');
                if (values.size() == 2) {
                    if (values[1] == "toggle")
                        values[1] = showBBoxes ? "off" : "on";

                    showBBoxes = values[1] == "on";
                    return true;
                }
            }
            return false;
        },
        "bboxes[,on|off]", "show/hide models bounding boxes"));
        m_commands_loaded = true;
    }
}